

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O0

void * ulist_getNext_63(UList *list)

{
  UListNode *pUVar1;
  UListNode *curr;
  UList *list_local;
  
  if ((list == (UList *)0x0) || (list->curr == (UListNode *)0x0)) {
    list_local = (UList *)0x0;
  }
  else {
    pUVar1 = list->curr;
    list->curr = pUVar1->next;
    list_local = (UList *)pUVar1->data;
  }
  return list_local;
}

Assistant:

U_CAPI void *U_EXPORT2 ulist_getNext(UList *list) {
    UListNode *curr = NULL;
    
    if (list == NULL || list->curr == NULL) {
        return NULL;
    }
    
    curr = list->curr;
    list->curr = curr->next;
    
    return curr->data;
}